

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_INCDEC_r(DisasContext_conflict1 *s,arg_incdec_cnt *a)

{
  int iVar1;
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var2;
  uint uVar3;
  TCGv_i64 ret;
  int iVar4;
  TCGv_i64 reg;
  int inc;
  uint numelem;
  uint fullsz;
  TCGContext_conflict1 *tcg_ctx;
  arg_incdec_cnt *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var2 = sve_access_check_aarch64(s);
  if (_Var2) {
    uVar3 = vec_full_reg_size(s);
    uVar3 = decode_pred_count(uVar3,a->pat,a->esz);
    iVar1 = a->imm;
    iVar4 = 1;
    if (a->d != 0) {
      iVar4 = -1;
    }
    ret = cpu_reg_aarch64(s,a->rd);
    tcg_gen_addi_i64_aarch64(tcg_ctx_00,ret,ret,(long)(int)(uVar3 * iVar1 * iVar4));
  }
  return true;
}

Assistant:

static bool trans_INCDEC_r(DisasContext *s, arg_incdec_cnt *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        unsigned fullsz = vec_full_reg_size(s);
        unsigned numelem = decode_pred_count(fullsz, a->pat, a->esz);
        int inc = numelem * a->imm * (a->d ? -1 : 1);
        TCGv_i64 reg = cpu_reg(s, a->rd);

        tcg_gen_addi_i64(tcg_ctx, reg, reg, inc);
    }
    return true;
}